

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * google::protobuf::Arena::CopyConstruct<google::protobuf::Struct>(Arena *arena,void *from)

{
  Struct *this;
  
  if (arena == (Arena *)0x0) {
    this = (Struct *)operator_new(0x48);
  }
  else {
    this = (Struct *)Allocate(arena,0x48);
  }
  Struct::Struct(this,arena,(Struct *)from);
  return this;
}

Assistant:

PROTOBUF_NOINLINE void* Arena::CopyConstruct(Arena* arena, const void* from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}